

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall Thread::~Thread(Thread *this)

{
  MutexLock *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  if ((this->started_ == true) && (this->joined_ == false)) {
    pthread_detach(this->pthreadId_);
  }
  pthread_cond_destroy((pthread_cond_t *)&(this->latch_).condition_.cond);
  __mutex = &(this->latch_).mutex_;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->func_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->func_,(_Any_data *)&this->func_,__destroy_functor);
  }
  return;
}

Assistant:

Thread::~Thread(){
    if(started_&&!joined_) pthread_detach(pthreadId_);
}